

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util_tests.cpp
# Opt level: O1

void __thiscall util_tests::test_ParseUInt16::test_method(test_ParseUInt16 *this)

{
  bool bVar1;
  iterator in_R8;
  iterator pvVar2;
  iterator in_R9;
  iterator pvVar3;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  const_string file_10;
  const_string file_11;
  const_string file_12;
  const_string file_13;
  const_string file_14;
  const_string file_15;
  const_string file_16;
  const_string file_17;
  const_string file_18;
  const_string file_19;
  const_string file_20;
  const_string file_21;
  const_string file_22;
  const_string file_23;
  const_string file_24;
  const_string file_25;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  const_string msg_13;
  const_string msg_14;
  const_string msg_15;
  const_string msg_16;
  const_string msg_17;
  const_string msg_18;
  const_string msg_19;
  const_string msg_20;
  const_string msg_21;
  const_string msg_22;
  const_string msg_23;
  const_string msg_24;
  const_string msg_25;
  string_view str;
  string_view str_00;
  string_view str_01;
  string_view str_02;
  string_view str_03;
  string_view str_04;
  string_view str_05;
  string_view str_06;
  string_view str_07;
  string_view str_08;
  string_view str_09;
  string_view str_10;
  string_view str_11;
  string_view str_12;
  string_view str_13;
  string_view str_14;
  string_view str_15;
  string_view str_16;
  string_view str_17;
  string_view str_18;
  string_view str_19;
  string_view str_20;
  string_view str_21;
  string_view str_22;
  string_view str_23;
  string_view str_24;
  uint16_t n;
  check_type cVar4;
  char *local_598;
  char *local_590;
  undefined1 *local_588;
  undefined1 *local_580;
  char *local_578;
  char *local_570;
  char *local_568;
  char *local_560;
  undefined1 *local_558;
  undefined1 *local_550;
  char *local_548;
  char *local_540;
  char *local_538;
  char *local_530;
  undefined1 *local_528;
  undefined1 *local_520;
  char *local_518;
  char *local_510;
  char *local_508;
  char *local_500;
  undefined1 *local_4f8;
  undefined1 *local_4f0;
  char *local_4e8;
  char *local_4e0;
  char *local_4d8;
  char *local_4d0;
  undefined1 *local_4c8;
  undefined1 *local_4c0;
  char *local_4b8;
  char *local_4b0;
  char *local_4a8;
  char *local_4a0;
  undefined1 *local_498;
  undefined1 *local_490;
  char *local_488;
  char *local_480;
  char *local_478;
  char *local_470;
  undefined1 *local_468;
  undefined1 *local_460;
  char *local_458;
  char *local_450;
  char *local_448;
  char *local_440;
  undefined1 *local_438;
  undefined1 *local_430;
  char *local_428;
  char *local_420;
  char *local_418;
  char *local_410;
  undefined1 *local_408;
  undefined1 *local_400;
  char *local_3f8;
  char *local_3f0;
  char *local_3e8;
  char *local_3e0;
  undefined1 *local_3d8;
  undefined1 *local_3d0;
  char *local_3c8;
  char *local_3c0;
  char *local_3b8;
  char *local_3b0;
  undefined1 *local_3a8;
  undefined1 *local_3a0;
  char *local_398;
  char *local_390;
  char *local_388;
  char *local_380;
  undefined1 *local_378;
  undefined1 *local_370;
  char *local_368;
  char *local_360;
  char *local_358;
  char *local_350;
  undefined1 *local_348;
  undefined1 *local_340;
  char *local_338;
  char *local_330;
  char *local_328;
  char *local_320;
  undefined1 *local_318;
  undefined1 *local_310;
  char *local_308;
  char *local_300;
  char *local_2f8;
  char *local_2f0;
  undefined1 *local_2e8;
  undefined1 *local_2e0;
  char *local_2d8;
  char *local_2d0;
  char *local_2c8;
  char *local_2c0;
  undefined1 *local_2b8;
  undefined1 *local_2b0;
  char *local_2a8;
  char *local_2a0;
  char *local_298;
  char *local_290;
  undefined1 *local_288;
  undefined1 *local_280;
  char *local_278;
  char *local_270;
  char *local_268;
  char *local_260;
  undefined1 *local_258;
  undefined1 *local_250;
  char *local_248;
  char *local_240;
  char *local_238;
  char *local_230;
  undefined1 *local_228;
  undefined1 *local_220;
  char *local_218;
  char *local_210;
  char *local_208;
  char *local_200;
  undefined1 *local_1f8;
  undefined1 *local_1f0;
  char *local_1e8;
  char *local_1e0;
  char *local_1d8;
  char *local_1d0;
  undefined1 *local_1c8;
  undefined1 *local_1c0;
  char *local_1b8;
  char *local_1b0;
  char *local_1a8;
  char *local_1a0;
  undefined1 *local_198;
  undefined1 *local_190;
  char *local_188;
  char *local_180;
  char *local_178;
  char *local_170;
  undefined1 *local_168;
  undefined1 *local_160;
  char *local_158;
  char *local_150;
  char *local_148;
  char *local_140;
  undefined1 *local_138;
  undefined1 *local_130;
  char *local_128;
  char *local_120;
  char *local_118;
  char *local_110;
  undefined1 *local_108;
  undefined1 *local_100;
  char *local_f8;
  char *local_f0;
  char *local_e8;
  char *local_e0;
  undefined1 *local_d8;
  undefined1 *local_d0;
  char *local_c8;
  char *local_c0;
  char *local_b8;
  char *local_b0;
  char *local_a8;
  char *local_a0;
  lazy_ostream local_98;
  undefined1 *local_88;
  char **local_80;
  assertion_result local_78;
  undefined1 *local_60;
  undefined1 *local_58;
  char *local_50;
  char *local_48;
  uint16_t local_3a;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_50 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_48 = "";
  local_60 = &boost::unit_test::basic_cstring<char_const>::null;
  local_58 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x390;
  file.m_begin = (iterator)&local_50;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_60,msg);
  str._M_str = "1234";
  str._M_len = 4;
  local_78.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)ParseUInt16(str,(uint16_t *)0x0);
  local_78.m_message.px = (element_type *)0x0;
  local_78.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_a8 = "ParseUInt16(\"1234\", nullptr)";
  local_a0 = "";
  local_98.m_empty = false;
  local_98._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3df0;
  local_88 = boost::unit_test::lazy_ostream::inst;
  local_b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_b0 = "";
  pvVar2 = (iterator)0x1;
  pvVar3 = (iterator)0x0;
  local_80 = &local_a8;
  boost::test_tools::tt_detail::report_assertion
            (&local_78,&local_98,1,0,WARN,_cVar4,(size_t)&local_b8,0x390);
  boost::detail::shared_count::~shared_count(&local_78.m_message.pn);
  local_c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_c0 = "";
  local_d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_d0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x391;
  file_00.m_begin = (iterator)&local_c8;
  msg_00.m_end = pvVar3;
  msg_00.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_d8,msg_00
            );
  str_00._M_str = "0";
  str_00._M_len = 1;
  bVar1 = ParseUInt16(str_00,&local_3a);
  local_78.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_3a == 0 && bVar1);
  local_78.m_message.px = (element_type *)0x0;
  local_78.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_a8 = "ParseUInt16(\"0\", &n) && n == 0";
  local_a0 = "";
  local_98.m_empty = false;
  local_98._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3df0;
  local_88 = boost::unit_test::lazy_ostream::inst;
  local_e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_e0 = "";
  pvVar2 = (iterator)0x1;
  pvVar3 = (iterator)0x0;
  local_80 = &local_a8;
  boost::test_tools::tt_detail::report_assertion
            (&local_78,&local_98,1,0,WARN,_cVar4,(size_t)&local_e8,0x391);
  boost::detail::shared_count::~shared_count(&local_78.m_message.pn);
  local_f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_f0 = "";
  local_108 = &boost::unit_test::basic_cstring<char_const>::null;
  local_100 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x392;
  file_01.m_begin = (iterator)&local_f8;
  msg_01.m_end = pvVar3;
  msg_01.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_108,
             msg_01);
  str_01._M_str = "1234";
  str_01._M_len = 4;
  bVar1 = ParseUInt16(str_01,&local_3a);
  local_78.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_3a == 0x4d2 && bVar1);
  local_78.m_message.px = (element_type *)0x0;
  local_78.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_a8 = "ParseUInt16(\"1234\", &n) && n == 1234";
  local_a0 = "";
  local_98.m_empty = false;
  local_98._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3df0;
  local_88 = boost::unit_test::lazy_ostream::inst;
  local_118 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_110 = "";
  pvVar2 = (iterator)0x1;
  pvVar3 = (iterator)0x0;
  local_80 = &local_a8;
  boost::test_tools::tt_detail::report_assertion
            (&local_78,&local_98,1,0,WARN,_cVar4,(size_t)&local_118,0x392);
  boost::detail::shared_count::~shared_count(&local_78.m_message.pn);
  local_128 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_120 = "";
  local_138 = &boost::unit_test::basic_cstring<char_const>::null;
  local_130 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x393;
  file_02.m_begin = (iterator)&local_128;
  msg_02.m_end = pvVar3;
  msg_02.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_138,
             msg_02);
  str_02._M_str = "01234";
  str_02._M_len = 5;
  bVar1 = ParseUInt16(str_02,&local_3a);
  local_78.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_3a == 0x4d2 && bVar1);
  local_78.m_message.px = (element_type *)0x0;
  local_78.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_a8 = "ParseUInt16(\"01234\", &n) && n == 1234";
  local_a0 = "";
  local_98.m_empty = false;
  local_98._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3df0;
  local_88 = boost::unit_test::lazy_ostream::inst;
  local_148 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_140 = "";
  pvVar2 = (iterator)0x1;
  pvVar3 = (iterator)0x0;
  local_80 = &local_a8;
  boost::test_tools::tt_detail::report_assertion
            (&local_78,&local_98,1,0,WARN,_cVar4,(size_t)&local_148,0x393);
  boost::detail::shared_count::~shared_count(&local_78.m_message.pn);
  local_158 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_150 = "";
  local_168 = &boost::unit_test::basic_cstring<char_const>::null;
  local_160 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x394;
  file_03.m_begin = (iterator)&local_158;
  msg_03.m_end = pvVar3;
  msg_03.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_168,
             msg_03);
  str_03._M_str = "65535";
  str_03._M_len = 5;
  bVar1 = ParseUInt16(str_03,&local_3a);
  local_78.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_3a == 0xffff && bVar1);
  local_78.m_message.px = (element_type *)0x0;
  local_78.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_a8 = "ParseUInt16(\"65535\", &n) && n == static_cast<uint16_t>(65535)";
  local_a0 = "";
  local_98.m_empty = false;
  local_98._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3df0;
  local_88 = boost::unit_test::lazy_ostream::inst;
  local_178 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_170 = "";
  pvVar2 = (iterator)0x1;
  pvVar3 = (iterator)0x0;
  local_80 = &local_a8;
  boost::test_tools::tt_detail::report_assertion
            (&local_78,&local_98,1,0,WARN,_cVar4,(size_t)&local_178,0x394);
  boost::detail::shared_count::~shared_count(&local_78.m_message.pn);
  local_188 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_180 = "";
  local_198 = &boost::unit_test::basic_cstring<char_const>::null;
  local_190 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0x395;
  file_04.m_begin = (iterator)&local_188;
  msg_04.m_end = pvVar3;
  msg_04.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_198,
             msg_04);
  str_04._M_str = "+65535";
  str_04._M_len = 6;
  bVar1 = ParseUInt16(str_04,&local_3a);
  local_78.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_3a == 0xffff && bVar1);
  local_78.m_message.px = (element_type *)0x0;
  local_78.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_a8 = "ParseUInt16(\"+65535\", &n) && n == 65535";
  local_a0 = "";
  local_98.m_empty = false;
  local_98._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3df0;
  local_88 = boost::unit_test::lazy_ostream::inst;
  local_1a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_1a0 = "";
  pvVar2 = (iterator)0x1;
  pvVar3 = (iterator)0x0;
  local_80 = &local_a8;
  boost::test_tools::tt_detail::report_assertion
            (&local_78,&local_98,1,0,WARN,_cVar4,(size_t)&local_1a8,0x395);
  boost::detail::shared_count::~shared_count(&local_78.m_message.pn);
  local_1b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_1b0 = "";
  local_1c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1c0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_05.m_end = (iterator)0x396;
  file_05.m_begin = (iterator)&local_1b8;
  msg_05.m_end = pvVar3;
  msg_05.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_1c8,
             msg_05);
  str_05._M_str = "00000000000000000012";
  str_05._M_len = 0x14;
  bVar1 = ParseUInt16(str_05,&local_3a);
  local_78.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_3a == 0xc && bVar1);
  local_78.m_message.px = (element_type *)0x0;
  local_78.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_a8 = "ParseUInt16(\"00000000000000000012\", &n) && n == 12";
  local_a0 = "";
  local_98.m_empty = false;
  local_98._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3df0;
  local_88 = boost::unit_test::lazy_ostream::inst;
  local_1d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_1d0 = "";
  pvVar2 = (iterator)0x1;
  pvVar3 = (iterator)0x0;
  local_80 = &local_a8;
  boost::test_tools::tt_detail::report_assertion
            (&local_78,&local_98,1,0,WARN,_cVar4,(size_t)&local_1d8,0x396);
  boost::detail::shared_count::~shared_count(&local_78.m_message.pn);
  local_1e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_1e0 = "";
  local_1f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1f0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_06.m_end = (iterator)0x397;
  file_06.m_begin = (iterator)&local_1e8;
  msg_06.m_end = pvVar3;
  msg_06.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_1f8,
             msg_06);
  str_06._M_str = "00000000000000000000";
  str_06._M_len = 0x14;
  bVar1 = ParseUInt16(str_06,&local_3a);
  local_78.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_3a == 0 && bVar1);
  local_78.m_message.px = (element_type *)0x0;
  local_78.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_a8 = "ParseUInt16(\"00000000000000000000\", &n) && n == 0";
  local_a0 = "";
  local_98.m_empty = false;
  local_98._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3df0;
  local_88 = boost::unit_test::lazy_ostream::inst;
  local_208 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_200 = "";
  pvVar2 = (iterator)0x1;
  pvVar3 = (iterator)0x0;
  local_80 = &local_a8;
  boost::test_tools::tt_detail::report_assertion
            (&local_78,&local_98,1,0,WARN,_cVar4,(size_t)&local_208,0x397);
  boost::detail::shared_count::~shared_count(&local_78.m_message.pn);
  local_218 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_210 = "";
  local_228 = &boost::unit_test::basic_cstring<char_const>::null;
  local_220 = &boost::unit_test::basic_cstring<char_const>::null;
  file_07.m_end = (iterator)0x399;
  file_07.m_begin = (iterator)&local_218;
  msg_07.m_end = pvVar3;
  msg_07.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_228,
             msg_07);
  str_07._M_str = "-00000000000000000000";
  str_07._M_len = 0x15;
  bVar1 = ParseUInt16(str_07,&local_3a);
  local_78.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)!bVar1;
  local_78.m_message.px = (element_type *)0x0;
  local_78.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_a8 = "!ParseUInt16(\"-00000000000000000000\", &n)";
  local_a0 = "";
  local_98.m_empty = false;
  local_98._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3df0;
  local_88 = boost::unit_test::lazy_ostream::inst;
  local_238 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_230 = "";
  pvVar2 = (iterator)0x1;
  pvVar3 = (iterator)0x0;
  local_80 = &local_a8;
  boost::test_tools::tt_detail::report_assertion
            (&local_78,&local_98,1,0,WARN,_cVar4,(size_t)&local_238,0x399);
  boost::detail::shared_count::~shared_count(&local_78.m_message.pn);
  local_248 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_240 = "";
  local_258 = &boost::unit_test::basic_cstring<char_const>::null;
  local_250 = &boost::unit_test::basic_cstring<char_const>::null;
  file_08.m_end = (iterator)0x39a;
  file_08.m_begin = (iterator)&local_248;
  msg_08.m_end = pvVar3;
  msg_08.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_258,
             msg_08);
  bVar1 = ParseUInt16((string_view)(ZEXT816(0xf98c4c) << 0x40),&local_3a);
  local_78.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)!bVar1;
  local_78.m_message.px = (element_type *)0x0;
  local_78.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_a8 = "!ParseUInt16(\"\", &n)";
  local_a0 = "";
  local_98.m_empty = false;
  local_98._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3df0;
  local_88 = boost::unit_test::lazy_ostream::inst;
  local_268 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_260 = "";
  pvVar2 = (iterator)0x1;
  pvVar3 = (iterator)0x0;
  local_80 = &local_a8;
  boost::test_tools::tt_detail::report_assertion
            (&local_78,&local_98,1,0,WARN,_cVar4,(size_t)&local_268,0x39a);
  boost::detail::shared_count::~shared_count(&local_78.m_message.pn);
  local_278 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_270 = "";
  local_288 = &boost::unit_test::basic_cstring<char_const>::null;
  local_280 = &boost::unit_test::basic_cstring<char_const>::null;
  file_09.m_end = (iterator)0x39b;
  file_09.m_begin = (iterator)&local_278;
  msg_09.m_end = pvVar3;
  msg_09.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_288,
             msg_09);
  str_08._M_str = " 1";
  str_08._M_len = 2;
  bVar1 = ParseUInt16(str_08,&local_3a);
  local_78.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)!bVar1;
  local_78.m_message.px = (element_type *)0x0;
  local_78.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_a8 = "!ParseUInt16(\" 1\", &n)";
  local_a0 = "";
  local_98.m_empty = false;
  local_98._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3df0;
  local_88 = boost::unit_test::lazy_ostream::inst;
  local_298 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_290 = "";
  pvVar2 = (iterator)0x1;
  pvVar3 = (iterator)0x0;
  local_80 = &local_a8;
  boost::test_tools::tt_detail::report_assertion
            (&local_78,&local_98,1,0,WARN,_cVar4,(size_t)&local_298,0x39b);
  boost::detail::shared_count::~shared_count(&local_78.m_message.pn);
  local_2a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_2a0 = "";
  local_2b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2b0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_10.m_end = (iterator)0x39c;
  file_10.m_begin = (iterator)&local_2a8;
  msg_10.m_end = pvVar3;
  msg_10.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_2b8,
             msg_10);
  str_09._M_str = " -1";
  str_09._M_len = 3;
  bVar1 = ParseUInt16(str_09,&local_3a);
  local_78.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)!bVar1;
  local_78.m_message.px = (element_type *)0x0;
  local_78.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_a8 = "!ParseUInt16(\" -1\", &n)";
  local_a0 = "";
  local_98.m_empty = false;
  local_98._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3df0;
  local_88 = boost::unit_test::lazy_ostream::inst;
  local_2c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_2c0 = "";
  pvVar2 = (iterator)0x1;
  pvVar3 = (iterator)0x0;
  local_80 = &local_a8;
  boost::test_tools::tt_detail::report_assertion
            (&local_78,&local_98,1,0,WARN,_cVar4,(size_t)&local_2c8,0x39c);
  boost::detail::shared_count::~shared_count(&local_78.m_message.pn);
  local_2d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_2d0 = "";
  local_2e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2e0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_11.m_end = (iterator)0x39d;
  file_11.m_begin = (iterator)&local_2d8;
  msg_11.m_end = pvVar3;
  msg_11.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)&local_2e8,
             msg_11);
  str_10._M_str = "++1";
  str_10._M_len = 3;
  bVar1 = ParseUInt16(str_10,&local_3a);
  local_78.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)!bVar1;
  local_78.m_message.px = (element_type *)0x0;
  local_78.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_a8 = "!ParseUInt16(\"++1\", &n)";
  local_a0 = "";
  local_98.m_empty = false;
  local_98._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3df0;
  local_88 = boost::unit_test::lazy_ostream::inst;
  local_2f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_2f0 = "";
  pvVar2 = (iterator)0x1;
  pvVar3 = (iterator)0x0;
  local_80 = &local_a8;
  boost::test_tools::tt_detail::report_assertion
            (&local_78,&local_98,1,0,WARN,_cVar4,(size_t)&local_2f8,0x39d);
  boost::detail::shared_count::~shared_count(&local_78.m_message.pn);
  local_308 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_300 = "";
  local_318 = &boost::unit_test::basic_cstring<char_const>::null;
  local_310 = &boost::unit_test::basic_cstring<char_const>::null;
  file_12.m_end = (iterator)0x39e;
  file_12.m_begin = (iterator)&local_308;
  msg_12.m_end = pvVar3;
  msg_12.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_12,(size_t)&local_318,
             msg_12);
  str_11._M_str = "+-1";
  str_11._M_len = 3;
  bVar1 = ParseUInt16(str_11,&local_3a);
  local_78.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)!bVar1;
  local_78.m_message.px = (element_type *)0x0;
  local_78.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_a8 = "!ParseUInt16(\"+-1\", &n)";
  local_a0 = "";
  local_98.m_empty = false;
  local_98._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3df0;
  local_88 = boost::unit_test::lazy_ostream::inst;
  local_328 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_320 = "";
  pvVar2 = (iterator)0x1;
  pvVar3 = (iterator)0x0;
  local_80 = &local_a8;
  boost::test_tools::tt_detail::report_assertion
            (&local_78,&local_98,1,0,WARN,_cVar4,(size_t)&local_328,0x39e);
  boost::detail::shared_count::~shared_count(&local_78.m_message.pn);
  local_338 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_330 = "";
  local_348 = &boost::unit_test::basic_cstring<char_const>::null;
  local_340 = &boost::unit_test::basic_cstring<char_const>::null;
  file_13.m_end = (iterator)0x39f;
  file_13.m_begin = (iterator)&local_338;
  msg_13.m_end = pvVar3;
  msg_13.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_13,(size_t)&local_348,
             msg_13);
  str_12._M_str = "-+1";
  str_12._M_len = 3;
  bVar1 = ParseUInt16(str_12,&local_3a);
  local_78.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)!bVar1;
  local_78.m_message.px = (element_type *)0x0;
  local_78.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_a8 = "!ParseUInt16(\"-+1\", &n)";
  local_a0 = "";
  local_98.m_empty = false;
  local_98._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3df0;
  local_88 = boost::unit_test::lazy_ostream::inst;
  local_358 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_350 = "";
  pvVar2 = (iterator)0x1;
  pvVar3 = (iterator)0x0;
  local_80 = &local_a8;
  boost::test_tools::tt_detail::report_assertion
            (&local_78,&local_98,1,0,WARN,_cVar4,(size_t)&local_358,0x39f);
  boost::detail::shared_count::~shared_count(&local_78.m_message.pn);
  local_368 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_360 = "";
  local_378 = &boost::unit_test::basic_cstring<char_const>::null;
  local_370 = &boost::unit_test::basic_cstring<char_const>::null;
  file_14.m_end = (iterator)0x3a0;
  file_14.m_begin = (iterator)&local_368;
  msg_14.m_end = pvVar3;
  msg_14.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_14,(size_t)&local_378,
             msg_14);
  str_13._M_str = "--1";
  str_13._M_len = 3;
  bVar1 = ParseUInt16(str_13,&local_3a);
  local_78.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)!bVar1;
  local_78.m_message.px = (element_type *)0x0;
  local_78.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_a8 = "!ParseUInt16(\"--1\", &n)";
  local_a0 = "";
  local_98.m_empty = false;
  local_98._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3df0;
  local_88 = boost::unit_test::lazy_ostream::inst;
  local_388 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_380 = "";
  pvVar2 = (iterator)0x1;
  pvVar3 = (iterator)0x0;
  local_80 = &local_a8;
  boost::test_tools::tt_detail::report_assertion
            (&local_78,&local_98,1,0,WARN,_cVar4,(size_t)&local_388,0x3a0);
  boost::detail::shared_count::~shared_count(&local_78.m_message.pn);
  local_398 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_390 = "";
  local_3a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3a0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_15.m_end = (iterator)0x3a1;
  file_15.m_begin = (iterator)&local_398;
  msg_15.m_end = pvVar3;
  msg_15.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_15,(size_t)&local_3a8,
             msg_15);
  str_14._M_str = "-1";
  str_14._M_len = 2;
  bVar1 = ParseUInt16(str_14,&local_3a);
  local_78.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)!bVar1;
  local_78.m_message.px = (element_type *)0x0;
  local_78.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_a8 = "!ParseUInt16(\"-1\", &n)";
  local_a0 = "";
  local_98.m_empty = false;
  local_98._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3df0;
  local_88 = boost::unit_test::lazy_ostream::inst;
  local_3b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_3b0 = "";
  pvVar2 = (iterator)0x1;
  pvVar3 = (iterator)0x0;
  local_80 = &local_a8;
  boost::test_tools::tt_detail::report_assertion
            (&local_78,&local_98,1,0,WARN,_cVar4,(size_t)&local_3b8,0x3a1);
  boost::detail::shared_count::~shared_count(&local_78.m_message.pn);
  local_3c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_3c0 = "";
  local_3d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3d0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_16.m_end = (iterator)0x3a2;
  file_16.m_begin = (iterator)&local_3c8;
  msg_16.m_end = pvVar3;
  msg_16.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_16,(size_t)&local_3d8,
             msg_16);
  str_15._M_str = "1 ";
  str_15._M_len = 2;
  bVar1 = ParseUInt16(str_15,&local_3a);
  local_78.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)!bVar1;
  local_78.m_message.px = (element_type *)0x0;
  local_78.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_a8 = "!ParseUInt16(\"1 \", &n)";
  local_a0 = "";
  local_98.m_empty = false;
  local_98._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3df0;
  local_88 = boost::unit_test::lazy_ostream::inst;
  local_3e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_3e0 = "";
  pvVar2 = (iterator)0x1;
  pvVar3 = (iterator)0x0;
  local_80 = &local_a8;
  boost::test_tools::tt_detail::report_assertion
            (&local_78,&local_98,1,0,WARN,_cVar4,(size_t)&local_3e8,0x3a2);
  boost::detail::shared_count::~shared_count(&local_78.m_message.pn);
  local_3f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_3f0 = "";
  local_408 = &boost::unit_test::basic_cstring<char_const>::null;
  local_400 = &boost::unit_test::basic_cstring<char_const>::null;
  file_17.m_end = (iterator)0x3a3;
  file_17.m_begin = (iterator)&local_3f8;
  msg_17.m_end = pvVar3;
  msg_17.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_17,(size_t)&local_408,
             msg_17);
  str_16._M_str = "1a";
  str_16._M_len = 2;
  bVar1 = ParseUInt16(str_16,&local_3a);
  local_78.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)!bVar1;
  local_78.m_message.px = (element_type *)0x0;
  local_78.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_a8 = "!ParseUInt16(\"1a\", &n)";
  local_a0 = "";
  local_98.m_empty = false;
  local_98._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3df0;
  local_88 = boost::unit_test::lazy_ostream::inst;
  local_418 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_410 = "";
  pvVar2 = (iterator)0x1;
  pvVar3 = (iterator)0x0;
  local_80 = &local_a8;
  boost::test_tools::tt_detail::report_assertion
            (&local_78,&local_98,1,0,WARN,_cVar4,(size_t)&local_418,0x3a3);
  boost::detail::shared_count::~shared_count(&local_78.m_message.pn);
  local_428 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_420 = "";
  local_438 = &boost::unit_test::basic_cstring<char_const>::null;
  local_430 = &boost::unit_test::basic_cstring<char_const>::null;
  file_18.m_end = (iterator)0x3a4;
  file_18.m_begin = (iterator)&local_428;
  msg_18.m_end = pvVar3;
  msg_18.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_18,(size_t)&local_438,
             msg_18);
  str_17._M_str = "aap";
  str_17._M_len = 3;
  bVar1 = ParseUInt16(str_17,&local_3a);
  local_78.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)!bVar1;
  local_78.m_message.px = (element_type *)0x0;
  local_78.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_a8 = "!ParseUInt16(\"aap\", &n)";
  local_a0 = "";
  local_98.m_empty = false;
  local_98._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3df0;
  local_88 = boost::unit_test::lazy_ostream::inst;
  local_448 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_440 = "";
  pvVar2 = (iterator)0x1;
  pvVar3 = (iterator)0x0;
  local_80 = &local_a8;
  boost::test_tools::tt_detail::report_assertion
            (&local_78,&local_98,1,0,WARN,_cVar4,(size_t)&local_448,0x3a4);
  boost::detail::shared_count::~shared_count(&local_78.m_message.pn);
  local_458 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_450 = "";
  local_468 = &boost::unit_test::basic_cstring<char_const>::null;
  local_460 = &boost::unit_test::basic_cstring<char_const>::null;
  file_19.m_end = (iterator)0x3a5;
  file_19.m_begin = (iterator)&local_458;
  msg_19.m_end = pvVar3;
  msg_19.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_19,(size_t)&local_468,
             msg_19);
  str_18._M_str = "0x1";
  str_18._M_len = 3;
  bVar1 = ParseUInt16(str_18,&local_3a);
  local_78.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)!bVar1;
  local_78.m_message.px = (element_type *)0x0;
  local_78.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_a8 = "!ParseUInt16(\"0x1\", &n)";
  local_a0 = "";
  local_98.m_empty = false;
  local_98._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3df0;
  local_88 = boost::unit_test::lazy_ostream::inst;
  local_478 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_470 = "";
  pvVar2 = (iterator)0x1;
  pvVar3 = (iterator)0x0;
  local_80 = &local_a8;
  boost::test_tools::tt_detail::report_assertion
            (&local_78,&local_98,1,0,WARN,_cVar4,(size_t)&local_478,0x3a5);
  boost::detail::shared_count::~shared_count(&local_78.m_message.pn);
  local_488 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_480 = "";
  local_498 = &boost::unit_test::basic_cstring<char_const>::null;
  local_490 = &boost::unit_test::basic_cstring<char_const>::null;
  file_20.m_end = (iterator)0x3a6;
  file_20.m_begin = (iterator)&local_488;
  msg_20.m_end = pvVar3;
  msg_20.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_20,(size_t)&local_498,
             msg_20);
  str_19._M_str = STRING_WITH_EMBEDDED_NULL_CHAR_abi_cxx11_._M_dataplus._M_p;
  str_19._M_len = STRING_WITH_EMBEDDED_NULL_CHAR_abi_cxx11_._M_string_length;
  bVar1 = ParseUInt16(str_19,&local_3a);
  local_78.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)!bVar1;
  local_78.m_message.px = (element_type *)0x0;
  local_78.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_a8 = "!ParseUInt16(STRING_WITH_EMBEDDED_NULL_CHAR, &n)";
  local_a0 = "";
  local_98.m_empty = false;
  local_98._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3df0;
  local_88 = boost::unit_test::lazy_ostream::inst;
  local_4a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_4a0 = "";
  pvVar2 = (iterator)0x1;
  pvVar3 = (iterator)0x0;
  local_80 = &local_a8;
  boost::test_tools::tt_detail::report_assertion
            (&local_78,&local_98,1,0,WARN,_cVar4,(size_t)&local_4a8,0x3a6);
  boost::detail::shared_count::~shared_count(&local_78.m_message.pn);
  local_4b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_4b0 = "";
  local_4c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4c0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_21.m_end = (iterator)0x3a8;
  file_21.m_begin = (iterator)&local_4b8;
  msg_21.m_end = pvVar3;
  msg_21.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_21,(size_t)&local_4c8,
             msg_21);
  str_20._M_str = "-65535";
  str_20._M_len = 6;
  bVar1 = ParseUInt16(str_20,&local_3a);
  local_78.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)!bVar1;
  local_78.m_message.px = (element_type *)0x0;
  local_78.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_a8 = "!ParseUInt16(\"-65535\", &n)";
  local_a0 = "";
  local_98.m_empty = false;
  local_98._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3df0;
  local_88 = boost::unit_test::lazy_ostream::inst;
  local_4d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_4d0 = "";
  pvVar2 = (iterator)0x1;
  pvVar3 = (iterator)0x0;
  local_80 = &local_a8;
  boost::test_tools::tt_detail::report_assertion
            (&local_78,&local_98,1,0,WARN,_cVar4,(size_t)&local_4d8,0x3a8);
  boost::detail::shared_count::~shared_count(&local_78.m_message.pn);
  local_4e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_4e0 = "";
  local_4f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4f0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_22.m_end = (iterator)0x3a9;
  file_22.m_begin = (iterator)&local_4e8;
  msg_22.m_end = pvVar3;
  msg_22.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_22,(size_t)&local_4f8,
             msg_22);
  str_21._M_str = "65536";
  str_21._M_len = 5;
  bVar1 = ParseUInt16(str_21,&local_3a);
  local_78.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)!bVar1;
  local_78.m_message.px = (element_type *)0x0;
  local_78.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_a8 = "!ParseUInt16(\"65536\", &n)";
  local_a0 = "";
  local_98.m_empty = false;
  local_98._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3df0;
  local_88 = boost::unit_test::lazy_ostream::inst;
  local_508 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_500 = "";
  pvVar2 = (iterator)0x1;
  pvVar3 = (iterator)0x0;
  local_80 = &local_a8;
  boost::test_tools::tt_detail::report_assertion
            (&local_78,&local_98,1,0,WARN,_cVar4,(size_t)&local_508,0x3a9);
  boost::detail::shared_count::~shared_count(&local_78.m_message.pn);
  local_518 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_510 = "";
  local_528 = &boost::unit_test::basic_cstring<char_const>::null;
  local_520 = &boost::unit_test::basic_cstring<char_const>::null;
  file_23.m_end = (iterator)0x3aa;
  file_23.m_begin = (iterator)&local_518;
  msg_23.m_end = pvVar3;
  msg_23.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_23,(size_t)&local_528,
             msg_23);
  str_22._M_str = "-123";
  str_22._M_len = 4;
  bVar1 = ParseUInt16(str_22,&local_3a);
  local_78.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)!bVar1;
  local_78.m_message.px = (element_type *)0x0;
  local_78.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_a8 = "!ParseUInt16(\"-123\", &n)";
  local_a0 = "";
  local_98.m_empty = false;
  local_98._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3df0;
  local_88 = boost::unit_test::lazy_ostream::inst;
  local_538 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_530 = "";
  pvVar2 = (iterator)0x1;
  pvVar3 = (iterator)0x0;
  local_80 = &local_a8;
  boost::test_tools::tt_detail::report_assertion
            (&local_78,&local_98,1,0,WARN,_cVar4,(size_t)&local_538,0x3aa);
  boost::detail::shared_count::~shared_count(&local_78.m_message.pn);
  local_548 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_540 = "";
  local_558 = &boost::unit_test::basic_cstring<char_const>::null;
  local_550 = &boost::unit_test::basic_cstring<char_const>::null;
  file_24.m_end = (iterator)0x3ab;
  file_24.m_begin = (iterator)&local_548;
  msg_24.m_end = pvVar3;
  msg_24.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_24,(size_t)&local_558,
             msg_24);
  str_23._M_str = "-123";
  str_23._M_len = 4;
  bVar1 = ParseUInt16(str_23,(uint16_t *)0x0);
  local_78.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)!bVar1;
  local_78.m_message.px = (element_type *)0x0;
  local_78.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_a8 = "!ParseUInt16(\"-123\", nullptr)";
  local_a0 = "";
  local_98.m_empty = false;
  local_98._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3df0;
  local_88 = boost::unit_test::lazy_ostream::inst;
  local_568 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_560 = "";
  pvVar2 = (iterator)0x1;
  pvVar3 = (iterator)0x0;
  local_80 = &local_a8;
  boost::test_tools::tt_detail::report_assertion
            (&local_78,&local_98,1,0,WARN,_cVar4,(size_t)&local_568,0x3ab);
  boost::detail::shared_count::~shared_count(&local_78.m_message.pn);
  local_578 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_570 = "";
  local_588 = &boost::unit_test::basic_cstring<char_const>::null;
  local_580 = &boost::unit_test::basic_cstring<char_const>::null;
  file_25.m_end = (iterator)0x3ac;
  file_25.m_begin = (iterator)&local_578;
  msg_25.m_end = pvVar3;
  msg_25.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_25,(size_t)&local_588,
             msg_25);
  str_24._M_str = "65536";
  str_24._M_len = 5;
  bVar1 = ParseUInt16(str_24,(uint16_t *)0x0);
  local_78.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)!bVar1;
  local_78.m_message.px = (element_type *)0x0;
  local_78.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_a8 = "!ParseUInt16(\"65536\", nullptr)";
  local_a0 = "";
  local_98.m_empty = false;
  local_98._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3df0;
  local_88 = boost::unit_test::lazy_ostream::inst;
  local_598 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_590 = "";
  local_80 = &local_a8;
  boost::test_tools::tt_detail::report_assertion
            (&local_78,&local_98,1,0,WARN,_cVar4,(size_t)&local_598,0x3ac);
  boost::detail::shared_count::~shared_count(&local_78.m_message.pn);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(test_ParseUInt16)
{
    uint16_t n;
    // Valid values
    BOOST_CHECK(ParseUInt16("1234", nullptr));
    BOOST_CHECK(ParseUInt16("0", &n) && n == 0);
    BOOST_CHECK(ParseUInt16("1234", &n) && n == 1234);
    BOOST_CHECK(ParseUInt16("01234", &n) && n == 1234); // no octal
    BOOST_CHECK(ParseUInt16("65535", &n) && n == static_cast<uint16_t>(65535));
    BOOST_CHECK(ParseUInt16("+65535", &n) && n == 65535);
    BOOST_CHECK(ParseUInt16("00000000000000000012", &n) && n == 12);
    BOOST_CHECK(ParseUInt16("00000000000000000000", &n) && n == 0);
    // Invalid values
    BOOST_CHECK(!ParseUInt16("-00000000000000000000", &n));
    BOOST_CHECK(!ParseUInt16("", &n));
    BOOST_CHECK(!ParseUInt16(" 1", &n)); // no padding inside
    BOOST_CHECK(!ParseUInt16(" -1", &n));
    BOOST_CHECK(!ParseUInt16("++1", &n));
    BOOST_CHECK(!ParseUInt16("+-1", &n));
    BOOST_CHECK(!ParseUInt16("-+1", &n));
    BOOST_CHECK(!ParseUInt16("--1", &n));
    BOOST_CHECK(!ParseUInt16("-1", &n));
    BOOST_CHECK(!ParseUInt16("1 ", &n));
    BOOST_CHECK(!ParseUInt16("1a", &n));
    BOOST_CHECK(!ParseUInt16("aap", &n));
    BOOST_CHECK(!ParseUInt16("0x1", &n)); // no hex
    BOOST_CHECK(!ParseUInt16(STRING_WITH_EMBEDDED_NULL_CHAR, &n));
    // Overflow and underflow
    BOOST_CHECK(!ParseUInt16("-65535", &n));
    BOOST_CHECK(!ParseUInt16("65536", &n));
    BOOST_CHECK(!ParseUInt16("-123", &n));
    BOOST_CHECK(!ParseUInt16("-123", nullptr));
    BOOST_CHECK(!ParseUInt16("65536", nullptr));
}